

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int isIncluded(void *in,void *container,size_t length)

{
  size_t u;
  char *into;
  char *ip;
  size_t length_local;
  void *container_local;
  void *in_local;
  
  for (u = 0; (u < length && (*(char *)((long)in + u) == *(char *)((long)container + u))); u = u + 1
      ) {
  }
  return (int)(u == length);
}

Assistant:

static int isIncluded(const void* in, const void* container, size_t length)
{
    const char* const ip = (const char*) in;
    const char* const into = (const char*) container;
    size_t u;

    for (u=0; u<length; u++) {  /* works because end of buffer is a noisy guard band */
        if (ip[u] != into[u]) break;
    }

    return u==length;
}